

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Pooling_x86_avx::forward(Pooling_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t _elemsize;
  _func_int **pp_Var7;
  int *piVar8;
  Mat *pMVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [16];
  Option *opt_00;
  _func_int *p_Var17;
  Option *pOVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar24;
  int iVar25;
  ulong uVar22;
  long lVar23;
  Pooling *this_00;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  void *pvVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  __m128 _inv_maxk;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_130;
  int local_120;
  allocator_type local_111;
  Mat *local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  ulong local_e0;
  Mat local_d8;
  _func_int **local_88;
  long local_80;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86_avx + (long)this->_vptr_Pooling_x86_avx[-3]);
  if (*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86_avx[-3]) != 0) {
LAB_001f2ee0:
    iVar10 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar10;
  }
  iVar10 = bottom_blob->w;
  iVar20 = bottom_blob->h;
  uVar11 = bottom_blob->c;
  uVar22 = (ulong)uVar11;
  _elemsize = bottom_blob->elemsize;
  local_110 = top_blob;
  if (bottom_blob->elempack != 4) {
    if (bottom_blob->elempack != 8) {
      if (((this_00->kernel_w == this_00->kernel_h) && (this_00->stride_w == this_00->stride_h)) &&
         ((this_00->stride_w == 2 &&
          (((this_00->pooling_type == 0 && (this_00->global_pooling != 1)) &&
           (this_00->kernel_w == 2)))))) {
        local_d8.cstep = 0;
        local_d8.data = (void *)0x0;
        local_d8.refcount._0_4_ = 0;
        local_d8.refcount._4_4_ = 0;
        local_d8.elemsize._0_4_ = 0;
        local_d8.elemsize._4_4_ = 0;
        local_d8.elempack = 0;
        local_d8.allocator = (Allocator *)0x0;
        local_d8.dims = 0;
        local_d8.w = 0;
        local_d8.h = 0;
        local_d8.d = 0;
        local_d8.c = 0;
        Pooling::make_padding(this_00,bottom_blob,&local_d8,opt);
        iVar10 = -100;
        if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
          p_Var17 = this->_vptr_Pooling_x86_avx[-3];
          Mat::create(top_blob,(local_d8.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
                               *(int *)(&this->field_0xdc + (long)p_Var17) + 1,
                      (local_d8.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
                      *(int *)(&this->field_0xe0 + (long)p_Var17) + 1,uVar11,_elemsize,
                      opt->blob_allocator);
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            pooling2x2s2_max_avx(&local_d8,top_blob,opt_00);
            iVar10 = 0;
          }
        }
        Mat::~Mat(&local_d8);
        return iVar10;
      }
      goto LAB_001f2ee0;
    }
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar11,_elemsize,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar20 = iVar20 * iVar10;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) == 0) {
        if ((int)uVar11 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          lVar19 = bottom_blob->cstep * uVar12 * bottom_blob->elemsize;
          auVar35 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar19);
          if (0 < iVar20) {
            pauVar15 = (undefined1 (*) [32])((long)bottom_blob->data + lVar19);
            iVar10 = iVar20;
            do {
              auVar35 = vmaxps_avx(auVar35,*pauVar15);
              pauVar15 = pauVar15 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar12 * 0x20) = auVar35;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar22);
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) != 1) {
        return 0;
      }
      if ((int)uVar11 < 1) {
        return 0;
      }
      auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar20)),
                            ZEXT416((uint)(1.0 / (float)iVar20)),0);
      uVar12 = 0;
      do {
        if (iVar20 < 1) {
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
        }
        else {
          pfVar14 = (float *)(bottom_blob->cstep * uVar12 * bottom_blob->elemsize +
                             (long)bottom_blob->data);
          fVar36 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          iVar10 = iVar20;
          do {
            fVar36 = fVar36 + *pfVar14;
            fVar42 = fVar42 + pfVar14[1];
            fVar43 = fVar43 + pfVar14[2];
            fVar44 = fVar44 + pfVar14[3];
            fVar45 = fVar45 + pfVar14[4];
            fVar46 = fVar46 + pfVar14[5];
            fVar47 = fVar47 + pfVar14[6];
            fVar48 = fVar48 + pfVar14[7];
            pfVar14 = pfVar14 + 8;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        pfVar14 = (float *)((long)top_blob->data + uVar12 * 0x20);
        *pfVar14 = fVar36 * auVar34._0_4_;
        pfVar14[1] = fVar42 * auVar34._4_4_;
        pfVar14[2] = fVar43 * auVar34._8_4_;
        pfVar14[3] = fVar44 * auVar34._12_4_;
        pfVar14[4] = fVar45 * auVar34._0_4_;
        pfVar14[5] = fVar46 * auVar34._4_4_;
        pfVar14[6] = fVar47 * auVar34._8_4_;
        pfVar14[7] = fVar48;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar22);
      return 0;
    }
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    local_d8.w = local_d8.refcount._4_4_;
    local_d8.h = (int)local_d8.elemsize;
    Pooling::make_padding(this_00,bottom_blob,&local_d8,opt);
    iVar10 = local_d8.w;
    pMVar9 = local_110;
    iVar20 = -100;
    if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
      p_Var17 = this->_vptr_Pooling_x86_avx[-3];
      uVar12 = (long)(local_d8.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
               (long)*(int *)(&this->field_0xdc + (long)p_Var17);
      local_f0 = uVar12 & 0xffffffff;
      local_e0 = CONCAT44(local_e0._4_4_,local_d8.h);
      uVar32 = (long)(local_d8.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
               (long)*(int *)(&this->field_0xe0 + (long)p_Var17);
      local_108 = uVar32 & 0xffffffff;
      uVar31 = (int)uVar12 + 1;
      Mat::create(local_110,uVar31,(int)uVar32 + 1,uVar11,_elemsize,8,opt->blob_allocator);
      if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
        uVar12 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx[-3]) *
                 (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx[-3]);
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar12,&local_111);
        pp_Var7 = this->_vptr_Pooling_x86_avx;
        p_Var17 = pp_Var7[-3];
        iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var17);
        if (0 < iVar20) {
          iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var17);
          iVar24 = 0;
          iVar27 = 0;
          iVar29 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
              lVar19 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar24 + lVar19] = iVar27 + (int)lVar19;
                p_Var17 = pp_Var7[-3];
                lVar19 = lVar19 + 1;
                iVar20 = (int)lVar19;
              } while (iVar20 < *(int *)(&this->field_0xd4 + (long)p_Var17));
              iVar24 = iVar24 + iVar20;
              iVar27 = iVar27 + iVar20;
            }
            iVar27 = iVar27 + (iVar10 - iVar25);
            iVar29 = iVar29 + 1;
            iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var17);
          } while (iVar29 < iVar20);
        }
        pOVar18 = (Option *)((long)&this->_vptr_Pooling_x86_avx + (long)p_Var17);
        iVar25 = (int)uVar12;
        if (*(int *)&pOVar18[3].workspace_allocator == 0) {
          iVar10 = *(int *)((long)&pOVar18[3].workspace_allocator + 4);
          if ((iVar20 == 2) && (iVar10 == 2)) {
            iVar2._0_1_ = pOVar18[3].use_winograd_convolution;
            iVar2._1_1_ = pOVar18[3].use_sgemm_convolution;
            iVar2._2_1_ = pOVar18[3].use_int8_inference;
            iVar2._3_1_ = pOVar18[3].use_vulkan_compute;
            if ((iVar2 == 2) &&
               (iVar3._0_1_ = pOVar18[3].use_bf16_storage, iVar3._1_1_ = pOVar18[3].use_fp16_packed,
               iVar3._2_1_ = pOVar18[3].use_fp16_storage,
               iVar3._3_1_ = pOVar18[3].use_fp16_arithmetic, iVar3 == 2)) {
              pooling2x2s2_max_pack8_avx(&local_d8,local_110,pOVar18);
            }
            else {
LAB_001f39c2:
              if (0 < (int)uVar11) {
                local_130 = 0;
                do {
                  if (-1 < (int)local_108) {
                    pvVar30 = (void *)(local_110->cstep * local_130 * local_110->elemsize +
                                      (long)local_110->data);
                    pp_Var7 = this->_vptr_Pooling_x86_avx;
                    iVar10 = 0;
                    do {
                      if (-1 < (int)local_f0) {
                        uVar32 = 0;
                        do {
                          lVar19 = (long)*(int *)(&this->field_0xe0 + (long)pp_Var7[-3]) *
                                   (long)iVar10 *
                                   (long)local_d8.w *
                                   CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize) +
                                   local_d8.cstep * local_130 *
                                   CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                          lVar21 = (long)(*(int *)(&this->field_0xdc + (long)pp_Var7[-3]) *
                                          (int)uVar32 * 8);
                          auVar35 = *(undefined1 (*) [32])
                                     ((long)local_d8.data + lVar21 * 4 + lVar19);
                          if (0 < iVar25) {
                            uVar26 = 0;
                            do {
                              auVar35 = vmaxps_avx(auVar35,*(undefined1 (*) [32])
                                                            ((long)local_d8.data +
                                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                                  0x20 + lVar21 * 4 + lVar19));
                              uVar26 = uVar26 + 1;
                            } while ((uVar12 & 0xffffffff) != uVar26);
                          }
                          *(undefined1 (*) [32])((long)pvVar30 + uVar32 * 0x20) = auVar35;
                          uVar32 = uVar32 + 1;
                        } while (uVar32 != uVar31);
                      }
                      pvVar30 = (void *)((long)pvVar30 + (long)(int)(uVar31 * 8) * 4);
                      bVar33 = iVar10 != (int)local_108;
                      iVar10 = iVar10 + 1;
                    } while (bVar33);
                  }
                  local_130 = local_130 + 1;
                } while (local_130 != uVar22);
              }
            }
          }
          else {
            if ((iVar20 != 3) ||
               (((iVar10 != 3 ||
                 (iVar4._0_1_ = pOVar18[3].use_winograd_convolution,
                 iVar4._1_1_ = pOVar18[3].use_sgemm_convolution,
                 iVar4._2_1_ = pOVar18[3].use_int8_inference,
                 iVar4._3_1_ = pOVar18[3].use_vulkan_compute, iVar4 != 2)) ||
                (iVar5._0_1_ = pOVar18[3].use_bf16_storage, iVar5._1_1_ = pOVar18[3].use_fp16_packed
                , iVar5._2_1_ = pOVar18[3].use_fp16_storage,
                iVar5._3_1_ = pOVar18[3].use_fp16_arithmetic, iVar5 != 2)))) goto LAB_001f39c2;
            pooling3x3s2_max_pack8_avx(&local_d8,local_110,pOVar18);
          }
        }
        else if (*(int *)&pOVar18[3].workspace_allocator == 1) {
          iVar1._0_1_ = pOVar18[3].use_reserved_8;
          iVar1._1_1_ = pOVar18[3].use_reserved_9;
          iVar1._2_1_ = pOVar18[3].use_reserved_10;
          iVar1._3_1_ = pOVar18[3].use_reserved_11;
          if (iVar1 == 0) {
            local_120 = 0;
            iVar6._0_1_ = pOVar18[3].use_reserved_4;
            iVar6._1_1_ = pOVar18[3].use_reserved_5;
            iVar6._2_1_ = pOVar18[3].use_reserved_6;
            iVar6._3_1_ = pOVar18[3].use_reserved_7;
            iVar20 = 0;
            if (iVar6 == 0) {
              iVar20 = (bottom_blob->w - local_d8.w) + *(int *)&pOVar18[3].use_int8_packed +
                       *(int *)&pOVar18[3].use_shader_pack8;
              local_120 = (bottom_blob->h - local_d8.h) + *(int *)&pOVar18[3].use_subgroup_shuffle +
                          pOVar18[3].flush_denormals;
            }
            if (0 < (int)uVar11) {
              local_120 = local_120 + (int)local_e0;
              local_60 = (long)(int)(uVar31 * 8);
              local_88 = this->_vptr_Pooling_x86_avx;
              local_50 = (ulong)uVar31;
              local_100 = 0;
              do {
                if (-1 < (int)local_108) {
                  local_68 = local_d8.data;
                  local_70 = CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  local_78 = (long)local_d8.w;
                  local_e8 = (void *)(local_110->cstep * local_100 * local_110->elemsize +
                                     (long)local_110->data);
                  local_80 = local_d8.cstep * local_100;
                  local_f8 = 0;
                  do {
                    if (-1 < (int)local_f0) {
                      lVar19 = (long)(*(int *)(&this->field_0xe0 + (long)local_88[-3]) *
                                     (int)local_f8);
                      local_58 = (void *)((local_78 * lVar19 + local_80) * local_70 +
                                         (long)local_d8.data);
                      uVar12 = 0;
                      do {
                        p_Var17 = local_88[-3];
                        if ((long)*(int *)(&this->field_0xd8 + (long)p_Var17) < 1) {
                          auVar39 = ZEXT864(0);
                          fVar36 = 0.0;
                        }
                        else {
                          lVar21 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)uVar12)
                          ;
                          pvVar30 = (void *)(lVar21 * 0x20 + (long)local_58);
                          lVar23 = 0;
                          auVar39 = ZEXT864(0);
                          iVar25 = 0;
                          do {
                            lVar28 = lVar23 + lVar19;
                            if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar28) {
                              if (local_120 - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar28)
                              break;
                              if (0 < (long)*(int *)(&this->field_0xd4 + (long)p_Var17)) {
                                lVar13 = 0;
                                lVar28 = lVar21;
                                do {
                                  if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar28) {
                                    if ((iVar20 + iVar10) -
                                        *(int *)(&this->field_0xe8 + (long)p_Var17) <= lVar28)
                                    break;
                                    pfVar14 = (float *)((long)pvVar30 + lVar13);
                                    auVar39 = ZEXT3264(CONCAT428(auVar39._28_4_ + pfVar14[7],
                                                                 CONCAT424(auVar39._24_4_ +
                                                                           pfVar14[6],
                                                                           CONCAT420(auVar39._20_4_
                                                                                     + pfVar14[5],
                                                                                     CONCAT416(
                                                  auVar39._16_4_ + pfVar14[4],
                                                  CONCAT412(auVar39._12_4_ + pfVar14[3],
                                                            CONCAT48(auVar39._8_4_ + pfVar14[2],
                                                                     CONCAT44(auVar39._4_4_ +
                                                                              pfVar14[1],
                                                                              auVar39._0_4_ +
                                                                              *pfVar14))))))));
                                    iVar25 = iVar25 + 1;
                                  }
                                  lVar13 = lVar13 + 0x20;
                                  lVar28 = lVar28 + 1;
                                } while ((long)*(int *)(&this->field_0xd4 + (long)p_Var17) * 0x20 !=
                                         lVar13);
                              }
                            }
                            lVar23 = lVar23 + 1;
                            pvVar30 = (void *)((long)pvVar30 + local_70 * local_78);
                          } while (lVar23 != *(int *)(&this->field_0xd8 + (long)p_Var17));
                          fVar36 = (float)iVar25;
                          local_e0 = uVar12;
                        }
                        auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / fVar36)),
                                              ZEXT416((uint)(1.0 / fVar36)),0);
                        auVar41._0_4_ = auVar34._0_4_ * auVar39._0_4_;
                        auVar41._4_4_ = auVar34._4_4_ * auVar39._4_4_;
                        auVar41._8_4_ = auVar34._8_4_ * auVar39._8_4_;
                        auVar41._12_4_ = auVar34._12_4_ * auVar39._12_4_;
                        auVar41._16_4_ = auVar34._0_4_ * auVar39._16_4_;
                        auVar41._20_4_ = auVar34._4_4_ * auVar39._20_4_;
                        auVar41._28_36_ = auVar39._28_36_;
                        auVar41._24_4_ = auVar34._8_4_ * auVar39._24_4_;
                        *(undefined1 (*) [32])((long)local_e8 + uVar12 * 0x20) = auVar41._0_32_;
                        uVar12 = uVar12 + 1;
                      } while (uVar12 != local_50);
                    }
                    local_e8 = (void *)((long)local_e8 + local_60 * 4);
                    uVar11 = (int)local_f8 + 1;
                    bVar33 = (int)local_f8 != (int)local_108;
                    local_f8 = (ulong)uVar11;
                  } while (bVar33);
                }
                local_100 = local_100 + 1;
              } while (local_100 != uVar22);
            }
          }
          else if (0 < (int)uVar11) {
            auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar25)),
                                  ZEXT416((uint)(1.0 / (float)iVar25)),0);
            local_130 = 0;
            do {
              if (-1 < (int)local_108) {
                pvVar30 = (void *)(local_110->cstep * local_130 * local_110->elemsize +
                                  (long)local_110->data);
                pp_Var7 = this->_vptr_Pooling_x86_avx;
                iVar10 = 0;
                do {
                  if (-1 < (int)local_f0) {
                    uVar32 = 0;
                    do {
                      if (iVar25 < 1) {
                        auVar39 = ZEXT864(0);
                      }
                      else {
                        auVar39 = ZEXT864(0);
                        uVar26 = 0;
                        do {
                          pfVar14 = (float *)((long)local_d8.data +
                                             (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                             0x20 + (long)(*(int *)(&this->field_0xdc +
                                                                   (long)pp_Var7[-3]) * (int)uVar32
                                                          * 8) * 4 +
                                                    (long)*(int *)(&this->field_0xe0 +
                                                                  (long)pp_Var7[-3]) * (long)iVar10
                                                    * (long)local_d8.w *
                                                      CONCAT44(local_d8.elemsize._4_4_,
                                                               (int)local_d8.elemsize) +
                                                    local_d8.cstep * local_130 *
                                                    CONCAT44(local_d8.elemsize._4_4_,
                                                             (int)local_d8.elemsize));
                          auVar39 = ZEXT3264(CONCAT428(auVar39._28_4_ + pfVar14[7],
                                                       CONCAT424(auVar39._24_4_ + pfVar14[6],
                                                                 CONCAT420(auVar39._20_4_ +
                                                                           pfVar14[5],
                                                                           CONCAT416(auVar39._16_4_
                                                                                     + pfVar14[4],
                                                                                     CONCAT412(
                                                  auVar39._12_4_ + pfVar14[3],
                                                  CONCAT48(auVar39._8_4_ + pfVar14[2],
                                                           CONCAT44(auVar39._4_4_ + pfVar14[1],
                                                                    auVar39._0_4_ + *pfVar14))))))))
                          ;
                          uVar26 = uVar26 + 1;
                        } while ((uVar12 & 0xffffffff) != uVar26);
                      }
                      auVar40._0_4_ = auVar39._0_4_ * auVar34._0_4_;
                      auVar40._4_4_ = auVar39._4_4_ * auVar34._4_4_;
                      auVar40._8_4_ = auVar39._8_4_ * auVar34._8_4_;
                      auVar40._12_4_ = auVar39._12_4_ * auVar34._12_4_;
                      auVar40._16_4_ = auVar39._16_4_ * auVar34._0_4_;
                      auVar40._20_4_ = auVar39._20_4_ * auVar34._4_4_;
                      auVar40._28_36_ = auVar39._28_36_;
                      auVar40._24_4_ = auVar39._24_4_ * auVar34._8_4_;
                      *(undefined1 (*) [32])((long)pvVar30 + uVar32 * 0x20) = auVar40._0_32_;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  pvVar30 = (void *)((long)pvVar30 + (long)(int)(uVar31 * 8) * 4);
                  bVar33 = iVar10 != (int)local_108;
                  iVar10 = iVar10 + 1;
                } while (bVar33);
              }
              local_130 = local_130 + 1;
            } while (local_130 != uVar22);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar20 = 0;
      }
    }
    piVar8 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar8 == (int *)0x0) {
      return iVar20;
    }
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 != 0) {
      return iVar20;
    }
    if (local_d8.allocator != (Allocator *)0x0) {
      (*(local_d8.allocator)->_vptr_Allocator[3])();
      return iVar20;
    }
    goto LAB_001f4251;
  }
  if (this_00->global_pooling != 0) {
    Mat::create(top_blob,uVar11,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar20 = iVar20 * iVar10;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) == 0) {
      if ((int)uVar11 < 1) {
        return 0;
      }
      uVar12 = 0;
      do {
        lVar19 = bottom_blob->cstep * uVar12 * bottom_blob->elemsize;
        auVar34 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar19);
        if (0 < iVar20) {
          pauVar16 = (undefined1 (*) [16])((long)bottom_blob->data + lVar19);
          iVar10 = iVar20;
          do {
            auVar34 = vmaxps_avx(auVar34,*pauVar16);
            pauVar16 = pauVar16 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar12 * 0x10) = auVar34;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar22);
      return 0;
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) != 1) {
      return 0;
    }
    if ((int)uVar11 < 1) {
      return 0;
    }
    auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar20)),ZEXT416((uint)(1.0 / (float)iVar20)),
                          0);
    uVar12 = 0;
    do {
      if (iVar20 < 1) {
        fVar36 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
      }
      else {
        pfVar14 = (float *)(bottom_blob->cstep * uVar12 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        fVar36 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        iVar10 = iVar20;
        do {
          fVar36 = fVar36 + *pfVar14;
          fVar42 = fVar42 + pfVar14[1];
          fVar43 = fVar43 + pfVar14[2];
          fVar44 = fVar44 + pfVar14[3];
          pfVar14 = pfVar14 + 4;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      pfVar14 = (float *)((long)top_blob->data + uVar12 * 0x10);
      *pfVar14 = fVar36 * auVar34._0_4_;
      pfVar14[1] = fVar42 * auVar34._4_4_;
      pfVar14[2] = fVar43 * auVar34._8_4_;
      pfVar14[3] = fVar44 * auVar34._12_4_;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar22);
    return 0;
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.h = (int)local_d8.elemsize;
  Pooling::make_padding(this_00,bottom_blob,&local_d8,opt);
  iVar10 = local_d8.w;
  pMVar9 = local_110;
  iVar20 = -100;
  if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
    p_Var17 = this->_vptr_Pooling_x86_avx[-3];
    uVar12 = (long)(local_d8.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
             (long)*(int *)(&this->field_0xdc + (long)p_Var17);
    local_f0 = uVar12 & 0xffffffff;
    local_e0 = CONCAT44(local_e0._4_4_,local_d8.h);
    uVar32 = (long)(local_d8.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
             (long)*(int *)(&this->field_0xe0 + (long)p_Var17);
    local_108 = uVar32 & 0xffffffff;
    uVar31 = (int)uVar12 + 1;
    Mat::create(local_110,uVar31,(int)uVar32 + 1,uVar11,_elemsize,4,opt->blob_allocator);
    if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
      uVar12 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx[-3]);
      std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar12,&local_111);
      pp_Var7 = this->_vptr_Pooling_x86_avx;
      p_Var17 = pp_Var7[-3];
      iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var17);
      if (0 < iVar20) {
        iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var17);
        iVar24 = 0;
        iVar27 = 0;
        iVar29 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
            lVar19 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar29 + lVar19] = iVar27 + (int)lVar19;
              p_Var17 = pp_Var7[-3];
              lVar19 = lVar19 + 1;
              iVar20 = (int)lVar19;
            } while (iVar20 < *(int *)(&this->field_0xd4 + (long)p_Var17));
            iVar29 = iVar29 + iVar20;
            iVar27 = iVar27 + iVar20;
          }
          iVar27 = iVar27 + (iVar10 - iVar25);
          iVar24 = iVar24 + 1;
          iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var17);
        } while (iVar24 < iVar20);
      }
      pOVar18 = (Option *)((long)&this->_vptr_Pooling_x86_avx + (long)p_Var17);
      iVar25 = (int)uVar12;
      if (*(int *)&pOVar18[3].workspace_allocator == 0) {
        iVar10 = *(int *)((long)&pOVar18[3].workspace_allocator + 4);
        if ((iVar20 == 2) && (iVar10 == 2)) {
          iVar24._0_1_ = pOVar18[3].use_winograd_convolution;
          iVar24._1_1_ = pOVar18[3].use_sgemm_convolution;
          iVar24._2_1_ = pOVar18[3].use_int8_inference;
          iVar24._3_1_ = pOVar18[3].use_vulkan_compute;
          if ((iVar24 == 2) &&
             (iVar27._0_1_ = pOVar18[3].use_bf16_storage, iVar27._1_1_ = pOVar18[3].use_fp16_packed,
             iVar27._2_1_ = pOVar18[3].use_fp16_storage,
             iVar27._3_1_ = pOVar18[3].use_fp16_arithmetic, iVar27 == 2)) {
            pooling2x2s2_max_pack4_sse(&local_d8,local_110,pOVar18);
          }
          else {
LAB_001f3b15:
            if (0 < (int)uVar11) {
              local_130 = 0;
              do {
                if (-1 < (int)local_108) {
                  pvVar30 = (void *)(local_110->cstep * local_130 * local_110->elemsize +
                                    (long)local_110->data);
                  pp_Var7 = this->_vptr_Pooling_x86_avx;
                  iVar10 = 0;
                  do {
                    if (-1 < (int)local_f0) {
                      uVar32 = 0;
                      do {
                        lVar19 = (long)*(int *)(&this->field_0xe0 + (long)pp_Var7[-3]) *
                                 (long)iVar10 *
                                 (long)local_d8.w *
                                 CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize) +
                                 local_d8.cstep * local_130 *
                                 CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                        lVar21 = (long)(*(int *)(&this->field_0xdc + (long)pp_Var7[-3]) *
                                        (int)uVar32 * 4);
                        auVar34 = *(undefined1 (*) [16])((long)local_d8.data + lVar21 * 4 + lVar19);
                        if (0 < iVar25) {
                          uVar26 = 0;
                          do {
                            auVar34 = vmaxps_avx(auVar34,*(undefined1 (*) [16])
                                                          ((long)local_d8.data +
                                                          (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                                  0x10 + lVar21 * 4 + lVar19));
                            uVar26 = uVar26 + 1;
                          } while ((uVar12 & 0xffffffff) != uVar26);
                        }
                        *(undefined1 (*) [16])((long)pvVar30 + uVar32 * 0x10) = auVar34;
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar31);
                    }
                    pvVar30 = (void *)((long)pvVar30 + (long)(int)(uVar31 * 4) * 4);
                    bVar33 = iVar10 != (int)local_108;
                    iVar10 = iVar10 + 1;
                  } while (bVar33);
                }
                local_130 = local_130 + 1;
              } while (local_130 != uVar22);
            }
          }
        }
        else {
          if ((iVar20 != 3) ||
             (((iVar10 != 3 ||
               (iVar10._0_1_ = pOVar18[3].use_winograd_convolution,
               iVar10._1_1_ = pOVar18[3].use_sgemm_convolution,
               iVar10._2_1_ = pOVar18[3].use_int8_inference,
               iVar10._3_1_ = pOVar18[3].use_vulkan_compute, iVar10 != 2)) ||
              (iVar20._0_1_ = pOVar18[3].use_bf16_storage, iVar20._1_1_ = pOVar18[3].use_fp16_packed
              , iVar20._2_1_ = pOVar18[3].use_fp16_storage,
              iVar20._3_1_ = pOVar18[3].use_fp16_arithmetic, iVar20 != 2)))) goto LAB_001f3b15;
          pooling3x3s2_max_pack4_sse(&local_d8,local_110,pOVar18);
        }
      }
      else if (*(int *)&pOVar18[3].workspace_allocator == 1) {
        iVar29._0_1_ = pOVar18[3].use_reserved_8;
        iVar29._1_1_ = pOVar18[3].use_reserved_9;
        iVar29._2_1_ = pOVar18[3].use_reserved_10;
        iVar29._3_1_ = pOVar18[3].use_reserved_11;
        if (iVar29 == 0) {
          iVar20 = 0;
          iVar25._0_1_ = pOVar18[3].use_reserved_4;
          iVar25._1_1_ = pOVar18[3].use_reserved_5;
          iVar25._2_1_ = pOVar18[3].use_reserved_6;
          iVar25._3_1_ = pOVar18[3].use_reserved_7;
          local_120 = 0;
          if (iVar25 == 0) {
            iVar20 = (bottom_blob->w - local_d8.w) + *(int *)&pOVar18[3].use_int8_packed +
                     *(int *)&pOVar18[3].use_shader_pack8;
            local_120 = (bottom_blob->h - local_d8.h) + *(int *)&pOVar18[3].use_subgroup_shuffle +
                        pOVar18[3].flush_denormals;
          }
          if (0 < (int)uVar11) {
            local_120 = local_120 + (int)local_e0;
            local_60 = (long)(int)(uVar31 * 4);
            local_88 = this->_vptr_Pooling_x86_avx;
            local_50 = (ulong)uVar31;
            local_100 = 0;
            do {
              if (-1 < (int)local_108) {
                local_68 = local_d8.data;
                local_70 = CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                local_78 = (long)local_d8.w;
                local_e8 = (void *)(local_110->cstep * local_100 * local_110->elemsize +
                                   (long)local_110->data);
                local_80 = local_d8.cstep * local_100;
                local_f8 = 0;
                do {
                  if (-1 < (int)local_f0) {
                    lVar19 = (long)(*(int *)(&this->field_0xe0 + (long)local_88[-3]) * (int)local_f8
                                   );
                    local_58 = (void *)((local_78 * lVar19 + local_80) * local_70 +
                                       (long)local_d8.data);
                    uVar12 = 0;
                    do {
                      p_Var17 = local_88[-3];
                      if ((long)*(int *)(&this->field_0xd8 + (long)p_Var17) < 1) {
                        fVar45 = 0.0;
                        fVar36 = 0.0;
                        fVar42 = 0.0;
                        fVar43 = 0.0;
                        fVar44 = 0.0;
                      }
                      else {
                        lVar21 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)uVar12);
                        pvVar30 = (void *)(lVar21 * 0x10 + (long)local_58);
                        fVar36 = 0.0;
                        fVar42 = 0.0;
                        fVar43 = 0.0;
                        fVar44 = 0.0;
                        lVar23 = 0;
                        iVar25 = 0;
                        do {
                          lVar28 = lVar23 + lVar19;
                          if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar28) {
                            if (local_120 - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar28)
                            break;
                            if (0 < (long)*(int *)(&this->field_0xd4 + (long)p_Var17)) {
                              lVar13 = 0;
                              lVar28 = lVar21;
                              do {
                                if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar28) {
                                  if ((iVar20 + iVar10) -
                                      *(int *)(&this->field_0xe8 + (long)p_Var17) <= lVar28) break;
                                  pfVar14 = (float *)((long)pvVar30 + lVar13);
                                  fVar36 = fVar36 + *pfVar14;
                                  fVar42 = fVar42 + pfVar14[1];
                                  fVar43 = fVar43 + pfVar14[2];
                                  fVar44 = fVar44 + pfVar14[3];
                                  iVar25 = iVar25 + 1;
                                }
                                lVar13 = lVar13 + 0x10;
                                lVar28 = lVar28 + 1;
                              } while ((long)*(int *)(&this->field_0xd4 + (long)p_Var17) * 0x10 !=
                                       lVar13);
                            }
                          }
                          lVar23 = lVar23 + 1;
                          pvVar30 = (void *)((long)pvVar30 + local_70 * local_78);
                        } while (lVar23 != *(int *)(&this->field_0xd8 + (long)p_Var17));
                        fVar45 = (float)iVar25;
                        local_e0 = uVar12;
                      }
                      auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / fVar45)),
                                            ZEXT416((uint)(1.0 / fVar45)),0);
                      auVar38._0_4_ = auVar34._0_4_ * fVar36;
                      auVar38._4_4_ = auVar34._4_4_ * fVar42;
                      auVar38._8_4_ = auVar34._8_4_ * fVar43;
                      auVar38._12_4_ = auVar34._12_4_ * fVar44;
                      *(undefined1 (*) [16])((long)local_e8 + uVar12 * 0x10) = auVar38;
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != local_50);
                  }
                  local_e8 = (void *)((long)local_e8 + local_60 * 4);
                  bVar33 = (int)local_f8 != (int)local_108;
                  local_f8 = (ulong)((int)local_f8 + 1);
                } while (bVar33);
              }
              local_100 = local_100 + 1;
            } while (local_100 != uVar22);
          }
        }
        else if (0 < (int)uVar11) {
          auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar25)),
                                ZEXT416((uint)(1.0 / (float)iVar25)),0);
          local_130 = 0;
          do {
            if (-1 < (int)local_108) {
              pvVar30 = (void *)(local_110->cstep * local_130 * local_110->elemsize +
                                (long)local_110->data);
              pp_Var7 = this->_vptr_Pooling_x86_avx;
              iVar10 = 0;
              do {
                if (-1 < (int)local_f0) {
                  uVar32 = 0;
                  do {
                    if (iVar25 < 1) {
                      fVar36 = 0.0;
                      fVar42 = 0.0;
                      fVar43 = 0.0;
                      fVar44 = 0.0;
                    }
                    else {
                      fVar36 = 0.0;
                      fVar42 = 0.0;
                      fVar43 = 0.0;
                      fVar44 = 0.0;
                      uVar26 = 0;
                      do {
                        pfVar14 = (float *)((long)local_d8.data +
                                           (long)local_48.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                           0x10 + (long)(*(int *)(&this->field_0xdc +
                                                                 (long)pp_Var7[-3]) * (int)uVar32 *
                                                        4) * 4 +
                                                  (long)*(int *)(&this->field_0xe0 +
                                                                (long)pp_Var7[-3]) * (long)iVar10 *
                                                  (long)local_d8.w *
                                                  CONCAT44(local_d8.elemsize._4_4_,
                                                           (int)local_d8.elemsize) +
                                                  local_d8.cstep * local_130 *
                                                  CONCAT44(local_d8.elemsize._4_4_,
                                                           (int)local_d8.elemsize));
                        fVar36 = fVar36 + *pfVar14;
                        fVar42 = fVar42 + pfVar14[1];
                        fVar43 = fVar43 + pfVar14[2];
                        fVar44 = fVar44 + pfVar14[3];
                        uVar26 = uVar26 + 1;
                      } while ((uVar12 & 0xffffffff) != uVar26);
                    }
                    auVar37._0_4_ = fVar36 * auVar34._0_4_;
                    auVar37._4_4_ = fVar42 * auVar34._4_4_;
                    auVar37._8_4_ = fVar43 * auVar34._8_4_;
                    auVar37._12_4_ = fVar44 * auVar34._12_4_;
                    *(undefined1 (*) [16])((long)pvVar30 + uVar32 * 0x10) = auVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar31);
                }
                pvVar30 = (void *)((long)pvVar30 + (long)(int)(uVar31 * 4) * 4);
                bVar33 = iVar10 != (int)local_108;
                iVar10 = iVar10 + 1;
              } while (bVar33);
            }
            local_130 = local_130 + 1;
          } while (local_130 != uVar22);
        }
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar20 = 0;
    }
  }
  piVar8 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar8 == (int *)0x0) {
    return iVar20;
  }
  LOCK();
  *piVar8 = *piVar8 + -1;
  UNLOCK();
  if (*piVar8 != 0) {
    return iVar20;
  }
  if (local_d8.allocator != (Allocator *)0x0) {
    (*(local_d8.allocator)->_vptr_Allocator[3])();
    return iVar20;
  }
LAB_001f4251:
  if (local_d8.data != (void *)0x0) {
    free(local_d8.data);
  }
  return iVar20;
}

Assistant:

int Pooling_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}